

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQClass::GetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *outval)

{
  bool bVar1;
  SQClassMember *pSVar2;
  SQObjectPtr *in_RDI;
  SQObjectPtr idx;
  SQClassMember *in_stack_ffffffffffffff90;
  SQClassMember *in_stack_ffffffffffffffa0;
  SQObjectPtr *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  SQObjectPtr local_30 [2];
  byte local_1;
  
  this_00 = local_30;
  ::SQObjectPtr::SQObjectPtr(this_00);
  bVar1 = SQTable::Get((SQTable *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       this_00,in_RDI);
  if (bVar1) {
    if ((local_30[0].super_SQObject._unVal.nInteger & 0x2000000U) == 0) {
      in_stack_ffffffffffffff90 =
           sqvector<SQClassMember>::operator[]
                     ((sqvector<SQClassMember> *)&in_RDI[5].super_SQObject._unVal,
                      (ulong)(local_30[0].super_SQObject._unVal._0_4_ & 0xffffff));
      pSVar2 = in_stack_ffffffffffffff90;
    }
    else {
      in_stack_ffffffffffffffa0 =
           sqvector<SQClassMember>::operator[]
                     ((sqvector<SQClassMember> *)(in_RDI + 4),
                      (ulong)(local_30[0].super_SQObject._unVal._0_4_ & 0xffffff));
      pSVar2 = in_stack_ffffffffffffffa0;
    }
    ::SQObjectPtr::operator=(&in_stack_ffffffffffffffa0->val,&pSVar2->attrs);
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  ::SQObjectPtr::~SQObjectPtr(&in_stack_ffffffffffffff90->val);
  return (bool)(local_1 & 1);
}

Assistant:

bool SQClass::GetAttributes(const SQObjectPtr &key,SQObjectPtr &outval)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        outval = (_isfield(idx)?_defaultvalues[_member_idx(idx)].attrs:_methods[_member_idx(idx)].attrs);
        return true;
    }
    return false;
}